

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc stbi__get_marker(stbi__jpeg *j)

{
  stbi_uc sVar1;
  stbi__context *psVar2;
  stbi_uc sVar3;
  stbi_uc *psVar4;
  
  sVar3 = j->marker;
  if (sVar3 == 0xff) {
    psVar2 = j->s;
    psVar4 = psVar2->img_buffer;
    if (psVar2->img_buffer_end <= psVar4) {
      if (psVar2->read_from_callbacks == 0) {
        return 0xff;
      }
      stbi__refill_buffer(psVar2);
      psVar4 = psVar2->img_buffer;
    }
    psVar2->img_buffer = psVar4 + 1;
    sVar3 = 0xff;
    sVar1 = *psVar4;
    while (sVar1 == 0xff) {
      psVar2 = j->s;
      psVar4 = psVar2->img_buffer;
      if (psVar2->img_buffer_end <= psVar4) {
        if (psVar2->read_from_callbacks == 0) {
          return '\0';
        }
        stbi__refill_buffer(psVar2);
        psVar4 = psVar2->img_buffer;
      }
      psVar2->img_buffer = psVar4 + 1;
      sVar3 = *psVar4;
      sVar1 = sVar3;
    }
  }
  else {
    j->marker = 0xff;
  }
  return sVar3;
}

Assistant:

static stbi_uc stbi__get_marker(stbi__jpeg *j)
{
   stbi_uc x;
   if (j->marker != STBI__MARKER_none) { x = j->marker; j->marker = STBI__MARKER_none; return x; }
   x = stbi__get8(j->s);
   if (x != 0xff) return STBI__MARKER_none;
   while (x == 0xff)
      x = stbi__get8(j->s); // consume repeated 0xff fill bytes
   return x;
}